

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O3

void __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::AddConstElementAccessToCaseBlock
          (ReplaceDescArrayAccessUsingVarIndex *this,BasicBlock *case_block,
          Instruction *access_chain,uint32_t const_element_idx,
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *old_ids_to_new_ids)

{
  IRContext *pIVar1;
  array<signed_char,_4UL> aVar2;
  uint32_t uVar3;
  Instruction *access_chain_00;
  array<signed_char,_4UL> *paVar4;
  mapped_type *ppBVar5;
  string message;
  size_type __dnew;
  undefined1 local_70 [24];
  uint *local_58;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_50;
  spv_position_t local_48;
  
  access_chain_00 = Instruction::Clone(access_chain,(this->super_Pass).context_);
  UseConstIndexForAccessChain(this,access_chain_00,const_element_idx);
  pIVar1 = (this->super_Pass).context_;
  aVar2._M_elems =
       (_Type)Module::TakeNextIdBound
                        ((pIVar1->module_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                         .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
  if ((aVar2._M_elems == (_Type)0x0) &&
     ((pIVar1->consumer_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    local_70._0_8_ = local_70 + 0x10;
    local_48.line._0_4_ = (array<signed_char,_4UL>)0x25;
    local_48.line._4_4_ = (array<signed_char,_4UL>)0x0;
    local_70._0_8_ = std::__cxx11::string::_M_create((ulong *)local_70,(ulong)&local_48);
    local_70._16_8_ = local_48.line;
    (((key_type)local_70._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
    _vptr_IntrusiveNodeBase = (_func_int **)0x667265766f204449;
    (((key_type)local_70._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ =
         (Instruction *)0x797254202e776f6c;
    (((key_type)local_70._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_
         = (Instruction *)0x676e696e6e757220;
    (((key_type)local_70._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ =
         true;
    (((key_type)local_70._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).field_0x19 =
         'c';
    (((key_type)local_70._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).field_0x1a =
         'o';
    (((key_type)local_70._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).field_0x1b =
         'm';
    (((key_type)local_70._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).field_0x1c =
         'p';
    (((key_type)local_70._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).field_0x1d =
         'a';
    (((key_type)local_70._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).field_0x1e =
         'c';
    (((key_type)local_70._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).field_0x1f =
         't';
    *(undefined8 *)
     &(((key_type)local_70._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).field_0x1d =
         0x2e7364692d746361;
    local_70._8_8_ = local_48.line;
    *(char *)((long)&(((key_type)local_70._0_8_)->
                     super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase +
             local_48.line) = '\0';
    local_48.line = 0;
    local_48.column = 0;
    local_48.index = 0;
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()(&pIVar1->consumer_,SPV_MSG_ERROR,"",&local_48,(char *)local_70._0_8_);
    if ((key_type)local_70._0_8_ != (key_type)(local_70 + 0x10)) {
      operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
    }
  }
  uVar3 = 0;
  if (access_chain_00->has_result_id_ == true) {
    uVar3 = Instruction::GetSingleWordOperand(access_chain_00,(uint)access_chain_00->has_type_id_);
  }
  local_70._0_4_ = uVar3;
  paVar4 = (array<signed_char,_4UL> *)
           std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)old_ids_to_new_ids,(key_type *)local_70);
  *&paVar4->_M_elems = aVar2._M_elems;
  if (access_chain_00->has_result_id_ == false) {
    __assert_fail("has_result_id_",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                  ,0x2c8,"void spvtools::opt::Instruction::SetResultId(uint32_t)");
  }
  if (aVar2._M_elems == (_Type)0x0) {
    __assert_fail("res_id != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                  ,0x2cd,"void spvtools::opt::Instruction::SetResultId(uint32_t)");
  }
  local_58 = (uint *)(local_70 + 0x10);
  local_70._0_8_ = &PTR__SmallVector_00b02ef8;
  local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_70[0x10] = aVar2._M_elems[0];
  local_70[0x11] = aVar2._M_elems[1];
  local_70[0x12] = aVar2._M_elems[2];
  local_70[0x13] = aVar2._M_elems[3];
  local_70._8_8_ = 1;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)
             ((long)((((access_chain_00->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_start)->words).buffer +
                    0xfffffffffffffffc) + (ulong)((uint)access_chain_00->has_type_id_ * 0x30)),
             (SmallVector<unsigned_int,_2UL> *)local_70);
  local_70._0_8_ = &PTR__SmallVector_00b02ef8;
  if (local_50._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_50,local_50._M_head_impl);
  }
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  analysis::DefUseManager::AnalyzeInstDefUse
            ((pIVar1->def_use_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
             access_chain_00);
  pIVar1 = (this->super_Pass).context_;
  local_70._0_8_ = access_chain_00;
  if ((pIVar1->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
    ppBVar5 = std::__detail::
              _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&pIVar1->instr_to_block_,(key_type *)local_70);
    *ppBVar5 = case_block;
  }
  utils::IntrusiveList<spvtools::opt::Instruction>::push_back
            (&(case_block->insts_).super_IntrusiveList<spvtools::opt::Instruction>,access_chain_00);
  return;
}

Assistant:

void ReplaceDescArrayAccessUsingVarIndex::AddConstElementAccessToCaseBlock(
    BasicBlock* case_block, Instruction* access_chain,
    uint32_t const_element_idx,
    std::unordered_map<uint32_t, uint32_t>* old_ids_to_new_ids) const {
  std::unique_ptr<Instruction> access_clone(access_chain->Clone(context()));
  UseConstIndexForAccessChain(access_clone.get(), const_element_idx);

  uint32_t new_access_id = context()->TakeNextId();
  (*old_ids_to_new_ids)[access_clone->result_id()] = new_access_id;
  access_clone->SetResultId(new_access_id);
  get_def_use_mgr()->AnalyzeInstDefUse(access_clone.get());

  context()->set_instr_block(access_clone.get(), case_block);
  case_block->AddInstruction(std::move(access_clone));
}